

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rs.c
# Opt level: O2

char * Qiniu_RS_PutPolicy_Token(Qiniu_RS_PutPolicy *auth,Qiniu_Mac *mac)

{
  Qiniu_Uint64 QVar1;
  long in_RAX;
  cJSON *object;
  cJSON *pcVar2;
  char *policy_str;
  char *pcVar3;
  Qiniu_Uint32 QVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  time_t deadline;
  long local_28;
  
  local_28 = in_RAX;
  object = cJSON_CreateObject();
  if (auth->scope != (char *)0x0) {
    pcVar2 = cJSON_CreateString(auth->scope);
    cJSON_AddItemToObject(object,"scope",pcVar2);
  }
  if (auth->isPrefixalScope != 0) {
    pcVar2 = cJSON_CreateNumber((double)auth->isPrefixalScope);
    cJSON_AddItemToObject(object,"isPrefixalScope",pcVar2);
  }
  if (auth->saveKey != (char *)0x0) {
    pcVar2 = cJSON_CreateString(auth->saveKey);
    cJSON_AddItemToObject(object,"saveKey",pcVar2);
  }
  if (auth->callbackUrl != (char *)0x0) {
    pcVar2 = cJSON_CreateString(auth->callbackUrl);
    cJSON_AddItemToObject(object,"callbackUrl",pcVar2);
  }
  if (auth->callbackHost != (char *)0x0) {
    pcVar2 = cJSON_CreateString(auth->callbackHost);
    cJSON_AddItemToObject(object,"callbackHost",pcVar2);
  }
  if (auth->callbackBody != (char *)0x0) {
    pcVar2 = cJSON_CreateString(auth->callbackBody);
    cJSON_AddItemToObject(object,"callbackBody",pcVar2);
  }
  if (auth->callbackBodyType != (char *)0x0) {
    pcVar2 = cJSON_CreateString(auth->callbackBodyType);
    cJSON_AddItemToObject(object,"callbackBodyType",pcVar2);
  }
  if (auth->callbackFetchKey != (char *)0x0) {
    pcVar2 = cJSON_CreateString(auth->callbackFetchKey);
    cJSON_AddItemToObject(object,"callbackFetchKey",pcVar2);
  }
  if (auth->returnUrl != (char *)0x0) {
    pcVar2 = cJSON_CreateString(auth->returnUrl);
    cJSON_AddItemToObject(object,"returnUrl",pcVar2);
  }
  if (auth->returnBody != (char *)0x0) {
    pcVar2 = cJSON_CreateString(auth->returnBody);
    cJSON_AddItemToObject(object,"returnBody",pcVar2);
  }
  if (auth->endUser != (char *)0x0) {
    pcVar2 = cJSON_CreateString(auth->endUser);
    cJSON_AddItemToObject(object,"endUser",pcVar2);
  }
  if (auth->persistentOps != (char *)0x0) {
    pcVar2 = cJSON_CreateString(auth->persistentOps);
    cJSON_AddItemToObject(object,"persistentOps",pcVar2);
  }
  if (auth->persistentNotifyUrl != (char *)0x0) {
    pcVar2 = cJSON_CreateString(auth->persistentNotifyUrl);
    cJSON_AddItemToObject(object,"persistentNotifyUrl",pcVar2);
  }
  if (auth->persistentPipeline != (char *)0x0) {
    pcVar2 = cJSON_CreateString(auth->persistentPipeline);
    cJSON_AddItemToObject(object,"persistentPipeline",pcVar2);
  }
  if (auth->persistentWorkflowTemplateID != (char *)0x0) {
    pcVar2 = cJSON_CreateString(auth->persistentWorkflowTemplateID);
    cJSON_AddItemToObject(object,"persistentWorkflowTemplateID",pcVar2);
  }
  if (auth->mimeLimit != (char *)0x0) {
    pcVar2 = cJSON_CreateString(auth->mimeLimit);
    cJSON_AddItemToObject(object,"mimeLimit",pcVar2);
  }
  if (auth->fsizeMin != 0) {
    auVar5._0_8_ = (double)CONCAT44(0x43300000,(int)auth->fsizeLimit);
    auVar5._8_4_ = (int)(auth->fsizeLimit >> 0x20);
    auVar5._12_4_ = 0x45300000;
    pcVar2 = cJSON_CreateNumber((auVar5._8_8_ - 1.9342813113834067e+25) +
                                (auVar5._0_8_ - 4503599627370496.0));
    cJSON_AddItemToObject(object,"fsizeMin",pcVar2);
  }
  QVar1 = auth->fsizeLimit;
  if (QVar1 != 0) {
    auVar6._8_4_ = (int)(QVar1 >> 0x20);
    auVar6._0_8_ = QVar1;
    auVar6._12_4_ = 0x45300000;
    pcVar2 = cJSON_CreateNumber((auVar6._8_8_ - 1.9342813113834067e+25) +
                                ((double)CONCAT44(0x43300000,(int)QVar1) - 4503599627370496.0));
    cJSON_AddItemToObject(object,"fsizeLimit",pcVar2);
  }
  if (auth->detectMime != 0) {
    pcVar2 = cJSON_CreateNumber((double)auth->detectMime);
    cJSON_AddItemToObject(object,"detectMime",pcVar2);
  }
  if (auth->insertOnly != 0) {
    pcVar2 = cJSON_CreateNumber((double)auth->insertOnly);
    cJSON_AddItemToObject(object,"insertOnly",pcVar2);
  }
  if (auth->deleteAfterDays != 0) {
    pcVar2 = cJSON_CreateNumber((double)auth->deleteAfterDays);
    cJSON_AddItemToObject(object,"deleteAfterDays",pcVar2);
  }
  if (auth->fileType != 0) {
    pcVar2 = cJSON_CreateNumber((double)auth->fileType);
    cJSON_AddItemToObject(object,"fileType",pcVar2);
  }
  if (auth->persistentType != 0) {
    pcVar2 = cJSON_CreateNumber((double)auth->persistentType);
    cJSON_AddItemToObject(object,"persistentType",pcVar2);
  }
  QVar4 = 0xe10;
  if (auth->expires != 0) {
    QVar4 = auth->expires;
  }
  time(&local_28);
  local_28 = (int)QVar4 + local_28;
  pcVar2 = cJSON_CreateNumber((double)local_28);
  cJSON_AddItemToObject(object,"deadline",pcVar2);
  policy_str = cJSON_PrintUnformatted(object);
  cJSON_Delete(object);
  pcVar3 = Qiniu_Mac_SignToken(mac,policy_str);
  Qiniu_Free(policy_str);
  return pcVar3;
}

Assistant:

char *Qiniu_RS_PutPolicy_Token(Qiniu_RS_PutPolicy *auth, Qiniu_Mac *mac)
{
    int expires;
    time_t deadline;
    char *authstr;
    char *token;

    cJSON *root = cJSON_CreateObject();

    if (auth->scope)
    {
        cJSON_AddStringToObject(root, "scope", auth->scope);
    }
    if (auth->isPrefixalScope)
    {
        cJSON_AddNumberToObject(root, "isPrefixalScope", auth->isPrefixalScope);
    }
    if (auth->saveKey)
    {
        cJSON_AddStringToObject(root, "saveKey", auth->saveKey);
    }
    if (auth->callbackUrl)
    {
        cJSON_AddStringToObject(root, "callbackUrl", auth->callbackUrl);
    }
    if (auth->callbackHost)
    {
        cJSON_AddStringToObject(root, "callbackHost", auth->callbackHost);
    }
    if (auth->callbackBody)
    {
        cJSON_AddStringToObject(root, "callbackBody", auth->callbackBody);
    }
    if (auth->callbackBodyType)
    {
        cJSON_AddStringToObject(root, "callbackBodyType", auth->callbackBodyType);
    }
    if (auth->callbackFetchKey)
    {
        cJSON_AddStringToObject(root, "callbackFetchKey", auth->callbackFetchKey);
    }
    if (auth->returnUrl)
    {
        cJSON_AddStringToObject(root, "returnUrl", auth->returnUrl);
    }
    if (auth->returnBody)
    {
        cJSON_AddStringToObject(root, "returnBody", auth->returnBody);
    }
    if (auth->endUser)
    {
        cJSON_AddStringToObject(root, "endUser", auth->endUser);
    }
    if (auth->persistentOps)
    {
        cJSON_AddStringToObject(root, "persistentOps", auth->persistentOps);
    }
    if (auth->persistentNotifyUrl)
    {
        cJSON_AddStringToObject(root, "persistentNotifyUrl", auth->persistentNotifyUrl);
    }
    if (auth->persistentPipeline)
    {
        cJSON_AddStringToObject(root, "persistentPipeline", auth->persistentPipeline);
    }
    if (auth->persistentWorkflowTemplateID)
    {
        cJSON_AddStringToObject(root, "persistentWorkflowTemplateID", auth->persistentWorkflowTemplateID);
    }
    if (auth->mimeLimit)
    {
        cJSON_AddStringToObject(root, "mimeLimit", auth->mimeLimit);
    }
    if (auth->fsizeMin)
    {
        cJSON_AddNumberToObject(root, "fsizeMin", auth->fsizeLimit);
    }
    if (auth->fsizeLimit)
    {
        cJSON_AddNumberToObject(root, "fsizeLimit", auth->fsizeLimit);
    }
    if (auth->detectMime)
    {
        cJSON_AddNumberToObject(root, "detectMime", auth->detectMime);
    }
    if (auth->insertOnly)
    {
        cJSON_AddNumberToObject(root, "insertOnly", auth->insertOnly);
    }
    if (auth->deleteAfterDays)
    {
        cJSON_AddNumberToObject(root, "deleteAfterDays", auth->deleteAfterDays);
    }
    if (auth->fileType)
    {
        cJSON_AddNumberToObject(root, "fileType", auth->fileType);
    }
    if (auth->persistentType)
    {
        cJSON_AddNumberToObject(root, "persistentType", auth->persistentType);
    }

    if (auth->expires)
    {
        expires = auth->expires;
    }
    else
    {
        expires = 3600; // 1小时
    }
    time(&deadline);
    deadline += expires;
    cJSON_AddNumberToObject(root, "deadline", deadline);

    authstr = cJSON_PrintUnformatted(root);
    cJSON_Delete(root);

    token = Qiniu_Mac_SignToken(mac, authstr);
    Qiniu_Free(authstr);

    return token;
}